

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O3

void __thiscall vector_brodnik<int>::grow(vector_brodnik<int> *this)

{
  pointer *pppiVar1;
  iterator __position;
  int *piVar2;
  uint16_t uVar3;
  size_t sVar4;
  
  if (this->_left_in_block == 0) {
    uVar3 = this->_left_in_superblock;
    if (uVar3 == 0) {
      if ((this->_superblock & 1) == 0) {
        this->_block_size = this->_block_size << 1;
        uVar3 = this->_superblock_size;
      }
      else {
        uVar3 = this->_superblock_size * 2;
        this->_superblock_size = uVar3;
      }
      this->_superblock = this->_superblock + 1;
      this->_left_in_superblock = uVar3;
    }
    sVar4 = this->_block_size;
    piVar2 = (int *)malloc(sVar4 * 4);
    this->_insertpos = piVar2;
    __position._M_current =
         (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                ((vector<int*,std::allocator<int*>> *)this,__position,&this->_insertpos);
      sVar4 = this->_block_size;
      uVar3 = this->_left_in_superblock;
    }
    else {
      *__position._M_current = piVar2;
      pppiVar1 = &(this->_index_block).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + 1;
    }
    this->_left_in_block = sVar4;
    this->_left_in_superblock = uVar3 - 1;
    return;
  }
  __assert_fail("_left_in_block == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/vector_brodnik.h"
                ,0x56,"void vector_brodnik<int>::grow() [T = int]");
}

Assistant:

void grow()
	{
		assert(_left_in_block == 0);
		if (_left_in_superblock == 0) {
			if (_superblock&1) { _superblock_size *= 2; }
			else               { _block_size *= 2;      }
			++_superblock;
			_left_in_superblock = _superblock_size;
		}
		_insertpos = static_cast<T*>(malloc(_block_size*sizeof(T)));
		_index_block.push_back(_insertpos);
		_left_in_block = _block_size;
		--_left_in_superblock;
	}